

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landbasedtracked.cpp
# Opt level: O0

void __thiscall fp::LandBasedTracked::Release(LandBasedTracked *this,string *string)

{
  ostream *poVar1;
  string *string_local;
  LandBasedTracked *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"LandBasedTracked::Release payload is called\n");
  poVar1 = std::operator<<(poVar1,(string *)string);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void fp::LandBasedTracked::Release(std::string string) {
    std::cerr << "LandBasedTracked::Release payload is called\n" << string << std::endl;
}